

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sLongShaderTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Stress::LongShaderCompileStressCase::verify
          (LongShaderCompileStressCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  bool bVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  RenderContext *pRVar3;
  undefined4 extraout_var_00;
  MessageBuilder *pMVar4;
  undefined7 extraout_var;
  MessageBuilder local_4c0;
  MessageBuilder local_340;
  MessageBuilder local_1b0;
  uint local_30;
  byte local_29;
  GLenum errorCode;
  bool isStrict;
  Functions *gl;
  TestLog *log;
  ShaderProgram *program_local;
  LongShaderCompileStressCase *this_local;
  
  log = (TestLog *)ctx;
  program_local = (ShaderProgram *)this;
  gl = (Functions *)
       tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pRVar3 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  _errorCode = CONCAT44(extraout_var_00,iVar2);
  local_29 = (this->m_flags & 1) != 0;
  local_30 = (**(code **)(_errorCode + 0x800))();
  if (((local_29 & 1) != 0) && (bVar1 = glu::ShaderProgram::isOk((ShaderProgram *)log), !bVar1)) {
    tcu::TestLog::operator<<(&local_1b0,(TestLog *)gl,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_1b0,
                        (char (*) [57])"Fail, expected program to compile and link successfully.");
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b0);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Linking failed");
  }
  bVar1 = glu::ShaderProgram::isOk((ShaderProgram *)log);
  iVar2 = (int)CONCAT71(extraout_var,bVar1);
  if ((bVar1) && (local_30 != 0)) {
    tcu::TestLog::operator<<(&local_340,(TestLog *)gl,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_340,
                        (char (*) [54])"Fail, program status OK but a GL error was received (");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_30);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2c23dab);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_340);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Conflicting status");
    iVar2 = extraout_EAX;
  }
  else if ((local_30 != 0) && (local_30 != 0x505)) {
    tcu::TestLog::operator<<(&local_4c0,(TestLog *)gl,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_4c0,
                        (char (*) [58])"Fail, expected GL_NO_ERROR or GL_OUT_OF_MEMORY, received ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_30);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2b6cb9a);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4c0);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Unexpected GL error");
    iVar2 = extraout_EAX_00;
  }
  return iVar2;
}

Assistant:

void LongShaderCompileStressCase::verify (const glu::ShaderProgram& program)
{
	tcu::TestLog&			log			= m_testCtx.getLog();
	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	const bool				isStrict	= (m_flags & CASE_REQUIRE_LINK_STATUS_OK) != 0;
	const glw::GLenum		errorCode	= gl.getError();

	if (isStrict && !program.isOk())
	{
		log << TestLog::Message << "Fail, expected program to compile and link successfully." << TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Linking failed");
	}

	if (program.isOk() && (errorCode != GL_NO_ERROR))
	{
		log << TestLog::Message << "Fail, program status OK but a GL error was received (" << errorCode << ")." << TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Conflicting status");
	}
	else if ((errorCode != GL_NO_ERROR) && (errorCode != GL_OUT_OF_MEMORY))
	{
		log << TestLog::Message << "Fail, expected GL_NO_ERROR or GL_OUT_OF_MEMORY, received " << errorCode << "." << TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Unexpected GL error");
	}
}